

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O1

bool __thiscall
bssl::SSLTranscript::AddToBufferOrHash(SSLTranscript *this,Span<const_unsigned_char> in)

{
  _Head_base<0UL,_buf_mem_st_*,_false> buf;
  int iVar1;
  EVP_MD *pEVar2;
  
  buf._M_head_impl =
       (this->buffer_)._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
  if ((buf._M_head_impl != (BUF_MEM *)0x0) &&
     (iVar1 = BUF_MEM_append(buf._M_head_impl,in.data_,in.size_), iVar1 == 0)) {
    return false;
  }
  pEVar2 = EVP_MD_CTX_md((EVP_MD_CTX *)&this->hash_);
  if (pEVar2 != (EVP_MD *)0x0) {
    EVP_DigestUpdate((EVP_MD_CTX *)&this->hash_,in.data_,in.size_);
  }
  return true;
}

Assistant:

bool SSLTranscript::AddToBufferOrHash(Span<const uint8_t> in) {
  // Depending on the state of the handshake, either the handshake buffer may be
  // active, the rolling hash, or both.
  if (buffer_ &&  //
      !BUF_MEM_append(buffer_.get(), in.data(), in.size())) {
    return false;
  }

  if (EVP_MD_CTX_md(hash_.get()) != NULL) {
    EVP_DigestUpdate(hash_.get(), in.data(), in.size());
  }

  return true;
}